

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

void __thiscall QSettings::~QSettings(QSettings *this)

{
  QObjectData *pQVar1;
  
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_006b0fc8;
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (*(char *)((long)&pQVar1[2].bindingStorage.d + 1) == '\x01') {
    (*pQVar1->_vptr_QObjectData[10])();
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QSettings::~QSettings()
{
    Q_D(QSettings);
    if (d->pendingChanges) {
        // Don't cause a failing flush() to std::terminate() the whole
        // application - dtors are implicitly noexcept!
        QT_TRY {
            d->flush();
        } QT_CATCH(...) {
        }
    }